

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-pickup.c
# Opt level: O0

void player_pickup_gold(player *p)

{
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  object *poVar5;
  object_kind *poVar6;
  char local_c8 [8];
  char buf [100];
  object_kind *kind;
  _Bool at_most_one;
  _Bool verbal;
  wchar_t sound_msg;
  object *next;
  object *obj;
  char name [30];
  int32_t total_gold;
  player *p_local;
  
  stack0xffffffffffffffec = 0;
  memset(&obj,0,0x1e);
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  poVar5 = square_object((chunk *)cave,grid);
  bVar2 = false;
  bVar1 = true;
  while (next = poVar5, next != (object *)0x0) {
    poVar5 = next->next;
    poVar6 = lookup_kind((uint)next->tval,(uint)next->sval);
    _Var3 = tval_is_money(next);
    if ((_Var3) && (poVar6 != (object_kind *)0x0)) {
      if ((stack0xffffffffffffffec == 0) || (iVar4 = strcmp(poVar6->name,(char *)&obj), iVar4 == 0))
      {
        my_strcpy((char *)&obj,poVar6->name,0x1e);
      }
      else {
        bVar1 = false;
      }
      _Var3 = ignore_item_ok(p,next);
      if (!_Var3) {
        bVar2 = true;
      }
      register0x00000000 = next->pval + stack0xffffffffffffffec;
      if (next->known != (object *)0x0) {
        grid_00.x = (p->grid).x;
        grid_00.y = (p->grid).y;
        square_delete_object((chunk *)p->cave,grid_00,next->known,false,false);
      }
      grid_01.x = (p->grid).x;
      grid_01.y = (p->grid).y;
      square_delete_object((chunk *)cave,grid_01,next,false,false);
    }
  }
  if (stack0xffffffffffffffec != 0) {
    strnfmt(local_c8,100,"You have found %ld gold pieces worth of ",(long)stack0xffffffffffffffec);
    if (bVar1) {
      my_strcat(local_c8,(char *)&obj,100);
    }
    else {
      my_strcat(local_c8,"treasures",100);
    }
    my_strcat(local_c8,".",100);
    if (stack0xffffffffffffffec < 200) {
      kind._4_4_ = 0x52;
    }
    else if (stack0xffffffffffffffec < 600) {
      kind._4_4_ = 0x53;
    }
    else {
      kind._4_4_ = 0x54;
    }
    if (bVar2) {
      msgt(kind._4_4_,"%s",local_c8);
    }
    p->au = stack0xffffffffffffffec + p->au;
    p->upkeep->redraw = p->upkeep->redraw | 0x100;
  }
  return;
}

Assistant:

static void player_pickup_gold(struct player *p)
{
	int32_t total_gold = 0L;
	char name[30] = "";

	struct object *obj = square_object(cave, p->grid), *next;

	int sound_msg;
	bool verbal = false;
	bool at_most_one = true;

	/* Pick up all the ordinary gold objects */
	while (obj) {
		struct object_kind *kind = NULL;

		/* Get next object */
		next = obj->next;

		/* Ignore if not legal treasure */
		kind = lookup_kind(obj->tval, obj->sval);
		if (!tval_is_money(obj) || !kind) {
			obj = next;
			continue;
		}

		/* Multiple types if we have a second name, otherwise record the name */
		if (total_gold && !streq(kind->name, name))
			at_most_one = false;
		else
			my_strcpy(name, kind->name, sizeof(name));

		/* Remember whether feedback message is in order */
		if (!ignore_item_ok(p, obj))
			verbal = true;

		/* Increment total value */
		total_gold += (int32_t)obj->pval;

		/* Delete the gold */
		if (obj->known) {
			square_delete_object(p->cave, p->grid, obj->known, false, false);
		}
		square_delete_object(cave, p->grid, obj, false, false);
		obj = next;
	}

	/* Pick up the gold, if present */
	if (total_gold) {
		char buf[100];

		/* Build a message */
		(void)strnfmt(buf, sizeof(buf),
			"You have found %ld gold pieces worth of ", (long)total_gold);

		/* One treasure type.. */
		if (at_most_one)
			my_strcat(buf, name, sizeof(buf));
		/* ... or more */
		else
			my_strcat(buf, "treasures", sizeof(buf));
		my_strcat(buf, ".", sizeof(buf));

		/* Determine which sound to play */
		if      (total_gold < 200) sound_msg = MSG_MONEY1;
		else if (total_gold < 600) sound_msg = MSG_MONEY2;
		else                       sound_msg = MSG_MONEY3;

		/* Display the message */
		if (verbal)
			msgt(sound_msg, "%s", buf);

		/* Add gold to purse */
		p->au += total_gold;

		/* Redraw gold */
		p->upkeep->redraw |= (PR_GOLD);
	}
}